

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cc
# Opt level: O0

void brotli::BuildMetaBlockGreedyWithContexts
               (uint8_t *ringbuffer,size_t pos,size_t mask,uint8_t prev_byte,uint8_t prev_byte2,
               ContextType literal_context_mode,size_t num_contexts,uint32_t *static_context_map,
               Command *commands,size_t n_commands,MetaBlockSplit *mb)

{
  byte bVar1;
  uint32_t uVar2;
  ulong uVar3;
  ulong uVar4;
  Command *pCVar5;
  byte bVar6;
  reference pvVar7;
  ulong local_200;
  size_t j_1;
  size_t i_2;
  uint8_t literal;
  size_t context;
  size_t j;
  Command cmd;
  ulong local_1b8;
  size_t i_1;
  BlockSplitter<brotli::Histogram<520>_> dist_blocks;
  undefined1 local_130 [8];
  BlockSplitter<brotli::Histogram<704>_> cmd_blocks;
  ContextBlockSplitter<brotli::Histogram<256>_> lit_blocks;
  size_t i;
  size_t num_literals;
  ContextType literal_context_mode_local;
  uint8_t prev_byte2_local;
  uint8_t prev_byte_local;
  size_t mask_local;
  size_t pos_local;
  uint8_t *ringbuffer_local;
  
  i = 0;
  for (lit_blocks.merge_last_count_ = 0; lit_blocks.merge_last_count_ < n_commands;
      lit_blocks.merge_last_count_ = lit_blocks.merge_last_count_ + 1) {
    i = commands[lit_blocks.merge_last_count_].insert_len_ + i;
  }
  ContextBlockSplitter<brotli::Histogram<256>_>::ContextBlockSplitter
            ((ContextBlockSplitter<brotli::Histogram<256>_> *)&cmd_blocks.merge_last_count_,0x100,
             num_contexts,0x200,400.0,i,&mb->literal_split,&mb->literal_histograms);
  BlockSplitter<brotli::Histogram<704>_>::BlockSplitter
            ((BlockSplitter<brotli::Histogram<704>_> *)local_130,0x2c0,0x400,500.0,n_commands,
             &mb->command_split,&mb->command_histograms);
  BlockSplitter<brotli::Histogram<520>_>::BlockSplitter
            ((BlockSplitter<brotli::Histogram<520>_> *)&i_1,0x40,0x200,100.0,n_commands,
             &mb->distance_split,&mb->distance_histograms);
  num_literals._6_1_ = prev_byte2;
  num_literals._7_1_ = prev_byte;
  mask_local = pos;
  for (local_1b8 = 0; local_1b8 < n_commands; local_1b8 = local_1b8 + 1) {
    pCVar5 = commands + local_1b8;
    uVar3._0_4_ = pCVar5->dist_extra_;
    uVar3._4_2_ = pCVar5->cmd_prefix_;
    uVar3._6_2_ = pCVar5->dist_prefix_;
    uVar4._0_4_ = commands[local_1b8].insert_len_;
    uVar4._4_4_ = commands[local_1b8].copy_len_;
    BlockSplitter<brotli::Histogram<704>_>::AddSymbol
              ((BlockSplitter<brotli::Histogram<704>_> *)local_130,uVar3 >> 0x20 & 0xffff);
    for (context = uVar4 & 0xffffffff; context != 0; context = context - 1) {
      bVar6 = Context(num_literals._7_1_,num_literals._6_1_,literal_context_mode);
      bVar1 = ringbuffer[mask_local & mask];
      ContextBlockSplitter<brotli::Histogram<256>_>::AddSymbol
                ((ContextBlockSplitter<brotli::Histogram<256>_> *)&cmd_blocks.merge_last_count_,
                 (ulong)bVar1,(ulong)static_context_map[bVar6]);
      num_literals._6_1_ = num_literals._7_1_;
      mask_local = mask_local + 1;
      num_literals._7_1_ = bVar1;
    }
    mask_local = (uint)uVar4._4_4_ + mask_local;
    if (uVar4._4_4_ != 0) {
      num_literals._6_1_ = ringbuffer[mask_local - 2 & mask];
      num_literals._7_1_ = ringbuffer[mask_local - 1 & mask];
      if (0x7f < (ushort)uVar3._4_2_) {
        BlockSplitter<brotli::Histogram<520>_>::AddSymbol
                  ((BlockSplitter<brotli::Histogram<520>_> *)&i_1,uVar3 >> 0x30);
      }
    }
  }
  ContextBlockSplitter<brotli::Histogram<256>_>::FinishBlock
            ((ContextBlockSplitter<brotli::Histogram<256>_> *)&cmd_blocks.merge_last_count_,true);
  BlockSplitter<brotli::Histogram<704>_>::FinishBlock
            ((BlockSplitter<brotli::Histogram<704>_> *)local_130,true);
  BlockSplitter<brotli::Histogram<520>_>::FinishBlock
            ((BlockSplitter<brotli::Histogram<520>_> *)&i_1,true);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&mb->literal_context_map,(mb->literal_split).num_types << 6);
  for (j_1 = 0; j_1 < (mb->literal_split).num_types; j_1 = j_1 + 1) {
    for (local_200 = 0; local_200 < 0x40; local_200 = local_200 + 1) {
      uVar2 = static_context_map[local_200];
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&mb->literal_context_map,j_1 * 0x40 + local_200);
      *pvVar7 = (int)j_1 * (int)num_contexts + uVar2;
    }
  }
  ContextBlockSplitter<brotli::Histogram<256>_>::~ContextBlockSplitter
            ((ContextBlockSplitter<brotli::Histogram<256>_> *)&cmd_blocks.merge_last_count_);
  return;
}

Assistant:

void BuildMetaBlockGreedyWithContexts(const uint8_t* ringbuffer,
                                      size_t pos,
                                      size_t mask,
                                      uint8_t prev_byte,
                                      uint8_t prev_byte2,
                                      ContextType literal_context_mode,
                                      size_t num_contexts,
                                      const uint32_t* static_context_map,
                                      const Command *commands,
                                      size_t n_commands,
                                      MetaBlockSplit* mb) {
  size_t num_literals = 0;
  for (size_t i = 0; i < n_commands; ++i) {
    num_literals += commands[i].insert_len_;
  }

  ContextBlockSplitter<HistogramLiteral> lit_blocks(
      256, num_contexts, 512, 400.0, num_literals,
      &mb->literal_split, &mb->literal_histograms);
  BlockSplitter<HistogramCommand> cmd_blocks(
      kNumCommandPrefixes, 1024, 500.0, n_commands,
      &mb->command_split, &mb->command_histograms);
  BlockSplitter<HistogramDistance> dist_blocks(
      64, 512, 100.0, n_commands,
      &mb->distance_split, &mb->distance_histograms);

  for (size_t i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    cmd_blocks.AddSymbol(cmd.cmd_prefix_);
    for (size_t j = cmd.insert_len_; j != 0; --j) {
      size_t context = Context(prev_byte, prev_byte2, literal_context_mode);
      uint8_t literal = ringbuffer[pos & mask];
      lit_blocks.AddSymbol(literal, static_context_map[context]);
      prev_byte2 = prev_byte;
      prev_byte = literal;
      ++pos;
    }
    pos += cmd.copy_len_;
    if (cmd.copy_len_ > 0) {
      prev_byte2 = ringbuffer[(pos - 2) & mask];
      prev_byte = ringbuffer[(pos - 1) & mask];
      if (cmd.cmd_prefix_ >= 128) {
        dist_blocks.AddSymbol(cmd.dist_prefix_);
      }
    }
  }

  lit_blocks.FinishBlock(/* is_final = */ true);
  cmd_blocks.FinishBlock(/* is_final = */ true);
  dist_blocks.FinishBlock(/* is_final = */ true);

  mb->literal_context_map.resize(
      mb->literal_split.num_types << kLiteralContextBits);
  for (size_t i = 0; i < mb->literal_split.num_types; ++i) {
    for (size_t j = 0; j < (1u << kLiteralContextBits); ++j) {
      mb->literal_context_map[(i << kLiteralContextBits) + j] =
          static_cast<uint32_t>(i * num_contexts) + static_context_map[j];
    }
  }
}